

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O0

void RunningLights(byte red,byte green,byte blue,int WaveDelay)

{
  __type _Var1;
  __type _Var2;
  __type _Var3;
  undefined4 local_1c;
  undefined4 local_18;
  int i;
  int j;
  int Position;
  int WaveDelay_local;
  byte blue_local;
  byte green_local;
  byte red_local;
  
  i = 0;
  for (local_18 = 0; local_18 < 0x30; local_18 = local_18 + 1) {
    i = i + 1;
    for (local_1c = 0; local_1c < 0x18; local_1c = local_1c + 1) {
      _Var1 = std::sin<int>(local_1c + i);
      _Var2 = std::sin<int>(local_1c + i);
      _Var3 = std::sin<int>(local_1c + i);
      setPixel(local_1c,(uchar)(int)(((_Var1 * 127.0 + 128.0) / 255.0) * (double)red),
               (uchar)(int)(((_Var2 * 127.0 + 128.0) / 255.0) * (double)green),
               (uchar)(int)(((_Var3 * 127.0 + 128.0) / 255.0) * (double)blue));
    }
    showStrip();
    delay(WaveDelay);
  }
  return;
}

Assistant:

void RunningLights(byte red, byte green, byte blue, int WaveDelay) {
    int Position=0;

    for(int j=0; j<NUM_LEDS*2; j++)
    {
        Position++;
        for(int i=0; i<NUM_LEDS; i++) {
            setPixel(i,((sin(i+Position) * 127 + 128)/255)*red,
                     ((sin(i+Position) * 127 + 128)/255)*green,
                     ((sin(i+Position) * 127 + 128)/255)*blue);
        }

        showStrip();
        delay(WaveDelay);
    }
}